

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall Jupiter::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int iVar2;
  char *hostname;
  char *port;
  addrinfo *extraout_RAX;
  addrinfo *extraout_RAX_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  ushort in_R8W;
  addrinfo *local_78;
  addrinfo *info;
  string local_60;
  addrinfo *local_40;
  addrinfo *info_head;
  long lStack_30;
  unsigned_short clientPort_local;
  char *clientAddress_local;
  char *pcStack_20;
  unsigned_short iPort_local;
  char *hostname_local;
  Socket *this_local;
  
  pcStack_20 = (char *)CONCAT44(in_register_00000034,__fd);
  lStack_30 = CONCAT44(in_register_0000000c,__len);
  clientAddress_local._6_2_ = (unsigned_short)__addr;
  info_head._6_2_ = in_R8W;
  hostname_local = (char *)this;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_data->remote_host,pcStack_20);
  this->m_data->remote_port = clientAddress_local._6_2_;
  hostname = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->m_data->remote_host);
  std::__cxx11::to_string(&local_60,(uint)this->m_data->remote_port);
  port = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                   (&local_60);
  local_78 = getAddrInfo(hostname,port);
  std::__cxx11::string::~string((string *)&local_60);
  local_40 = local_78;
  if (local_78 != (addrinfo *)0x0) {
    do {
      if (lStack_30 == 0) {
        iVar2 = socket(local_78->ai_family,this->m_data->sockType,this->m_data->sockProto);
        this->m_data->rawSock = iVar2;
        if (this->m_data->rawSock != -1) goto LAB_001c4dda;
        local_78 = local_78->ai_next;
      }
      else {
        uVar1 = bind(this,(int)lStack_30,(sockaddr *)(ulong)info_head._6_2_,0);
        if ((uVar1 & 1) == 0) break;
LAB_001c4dda:
        iVar2 = ::connect(this->m_data->rawSock,(sockaddr *)local_78->ai_addr,local_78->ai_addrlen);
        if (iVar2 != -1) {
          freeAddrInfo(local_40);
          this_local._7_1_ = 1;
          local_78 = extraout_RAX;
          goto LAB_001c4e5b;
        }
        ::close(this->m_data->rawSock);
        this->m_data->rawSock = -1;
        local_78 = local_78->ai_next;
      }
    } while (local_78 != (addrinfo *)0x0);
    freeAddrInfo(local_40);
    local_78 = extraout_RAX_00;
  }
  this_local._7_1_ = 0;
LAB_001c4e5b:
  return (int)CONCAT71((int7)((ulong)local_78 >> 8),this_local._7_1_);
}

Assistant:

bool Jupiter::Socket::connect(const char *hostname, unsigned short iPort, const char *clientAddress, unsigned short clientPort) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init())
		return false;
#endif // _WIN32
	m_data->remote_host = hostname;
	m_data->remote_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->remote_host.c_str(), std::to_string(m_data->remote_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			if (clientAddress != nullptr) {
				// bind will initialize our socket
				if (Jupiter::Socket::bind(clientAddress, clientPort, false) == false)
					break;
			}
			else {
				m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
				if (m_data->rawSock == INVALID_SOCKET) {
					info = info->ai_next;
					continue;
				}
			}

			if (::connect(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}